

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_append.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  in_addr_t iVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  sockaddr_in sin;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  char mem [102400];
  sockaddr sStack_19080;
  undefined1 auStack_19070 [8];
  undefined8 uStack_19068;
  undefined1 auStack_19038 [102408];
  
  iVar3 = 0x100007f;
  if (1 < argc) {
    iVar3 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    sftppath = argv[5];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    main_cold_8();
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_7();
  }
  else {
    sStack_19080.sa_family = 2;
    sStack_19080.sa_data[0] = '\0';
    sStack_19080.sa_data[1] = '\x16';
    sStack_19080.sa_data._2_4_ = iVar3;
    iVar5 = connect(__fd,&sStack_19080,0x10);
    if (iVar5 == 0) {
      lVar6 = libssh2_session_init_ex(0,0,0,0);
      if (lVar6 != 0) {
        libssh2_session_set_blocking(lVar6,1);
        uVar4 = libssh2_session_handshake(lVar6,__fd);
        if (uVar4 == 0) {
          lVar7 = libssh2_hostkey_hash(lVar6,2);
          fwrite("Fingerprint: ",0xd,1,_stderr);
          lVar11 = 0;
          do {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar11));
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x14);
          fputc(10,_stderr);
          pcVar1 = username;
          sVar8 = strlen(username);
          pcVar2 = password;
          sVar9 = strlen(password);
          iVar5 = libssh2_userauth_password_ex(lVar6,pcVar1,sVar8,pcVar2,sVar9 & 0xffffffff,0);
          if (iVar5 == 0) {
            fwrite("libssh2_sftp_init()!\n",0x15,1,_stderr);
            lVar7 = libssh2_sftp_init(lVar6);
            if (lVar7 == 0) {
              main_cold_5();
            }
            else {
              fwrite("libssh2_sftp_open() for READ and WRITE!\n",0x28,1,_stderr);
              pcVar1 = sftppath;
              sVar8 = strlen(sftppath);
              lVar11 = libssh2_sftp_open_ex(lVar7,pcVar1,sVar8 & 0xffffffff,3,0x1a4,0);
              if (lVar11 == 0) {
                main_cold_4();
              }
              else {
                iVar5 = libssh2_sftp_fstat_ex(lVar11,auStack_19070,0);
                if (iVar5 < 0) {
                  main_cold_3();
                }
                else {
                  libssh2_sftp_seek64(lVar11,uStack_19068);
                  fprintf(_stderr,"Did a seek to position %ld\n",uStack_19068);
                  fwrite("libssh2_sftp_open() a handle for APPEND\n",0x28,1,_stderr);
                  fwrite("libssh2_sftp_open() is done, now send data!\n",0x2c,1,_stderr);
                  do {
                    sVar8 = fread(auStack_19038,1,0x19000,__stream);
                    puVar12 = auStack_19038;
                    if (sVar8 == 0) break;
                    do {
                      lVar10 = libssh2_sftp_write(lVar11,puVar12,sVar8);
                      if (lVar10 < 0) break;
                      sVar8 = sVar8 - lVar10;
                      puVar12 = puVar12 + lVar10;
                    } while (sVar8 != 0);
                  } while (0 < lVar10);
                  libssh2_sftp_close_handle(lVar11);
                  libssh2_sftp_shutdown(lVar7);
                }
              }
            }
          }
          else {
            main_cold_2();
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
        }
        goto LAB_0010151d;
      }
      main_cold_6();
    }
    else {
      main_cold_1();
    }
  }
  lVar6 = 0;
LAB_0010151d:
  if (lVar6 != 0) {
    libssh2_session_disconnect_ex(lVar6,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar6);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fclose(__stream);
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
    LIBSSH2_SFTP_ATTRIBUTES attrs;
    char mem[1024 * 100];
    FILE *local;
    size_t nread;
    ssize_t nwritten;
    char *ptr;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        sftppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() for READ and WRITE!\n");
    /* Request a file via SFTP */
    sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                    LIBSSH2_FXF_WRITE |
                                    LIBSSH2_FXF_READ,
                                    LIBSSH2_SFTP_S_IRUSR |
                                    LIBSSH2_SFTP_S_IWUSR |
                                    LIBSSH2_SFTP_S_IRGRP |
                                    LIBSSH2_SFTP_S_IROTH);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    if(libssh2_sftp_fstat_ex(sftp_handle, &attrs, 0) < 0) {
        fprintf(stderr, "libssh2_sftp_fstat_ex failed\n");
        goto shutdown;
    }
    else
        libssh2_sftp_seek64(sftp_handle, attrs.filesize);
    fprintf(stderr, "Did a seek to position %ld\n", (long) attrs.filesize);

    fprintf(stderr, "libssh2_sftp_open() a handle for APPEND\n");
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() is done, now send data!\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            /* write data in a loop until we block */
            nwritten = libssh2_sftp_write(sftp_handle, ptr, nread);
            if(nwritten < 0)
                break;
            ptr += nwritten;
            nread -= nwritten;
        } while(nread);

    } while(nwritten > 0);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}